

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move.hpp
# Opt level: O2

void __thiscall Movegen::generate<(Movetype)14,(Piece)6>(Movegen *this)

{
  byte bVar1;
  ulong uVar2;
  
  uVar2 = this->check_target;
  if (uVar2 == 0) {
    generate<(Movetype)16,(Piece)0>(this);
    generate<(Movetype)15,(Piece)0>(this);
    generate<(Movetype)14,(Piece)1>(this);
    generate<(Movetype)14,(Piece)2>(this);
    generate<(Movetype)14,(Piece)3>(this);
    generate<(Movetype)14,(Piece)4>(this);
    generate<(Movetype)11,(Piece)0>(this);
    generate<(Movetype)10,(Piece)0>(this);
    generate<(Movetype)10,(Piece)5>(this);
    generate<(Movetype)13,(Piece)5>(this);
    generate<(Movetype)11,(Piece)5>(this);
    return;
  }
  uVar2 = uVar2 - (uVar2 >> 1 & 0x5555555555555555);
  uVar2 = (uVar2 >> 2 & 0x3333333333333333) + (uVar2 & 0x3333333333333333);
  bVar1 = (byte)(((uVar2 >> 4) + uVar2 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
  if (this->evasion_target == 0) {
    if (bVar1 < 2) {
      generate<(Movetype)16,(Piece)0>(this);
      generate<(Movetype)11,(Piece)5>(this);
      generate<(Movetype)11,(Piece)0>(this);
      generate<(Movetype)11,(Piece)1>(this);
      generate<(Movetype)11,(Piece)2>(this);
      generate<(Movetype)11,(Piece)3>(this);
      generate<(Movetype)11,(Piece)4>(this);
      goto LAB_0012339d;
    }
  }
  else if (bVar1 < 2) {
    generate<(Movetype)16,(Piece)0>(this);
    generate<(Movetype)11,(Piece)5>(this);
    generate<(Movetype)11,(Piece)0>(this);
    generate<(Movetype)14,(Piece)1>(this);
    generate<(Movetype)14,(Piece)2>(this);
    generate<(Movetype)14,(Piece)3>(this);
    generate<(Movetype)14,(Piece)4>(this);
    generate<(Movetype)15,(Piece)0>(this);
    generate<(Movetype)10,(Piece)5>(this);
    generate<(Movetype)10,(Piece)0>(this);
    return;
  }
  generate<(Movetype)11,(Piece)5>(this);
LAB_0012339d:
  generate<(Movetype)10,(Piece)5>(this);
  return;
}

Assistant:

inline void Movegen::generate<pseudo_legal, pieces>() {
	// todo: order move generation by game phase
	// data-driven approach for this?
	if (check_target == 0ULL) { // all moves
		generate<capture_promotion, pawn>();
		generate<promotion, pawn>();
		generate<pseudo_legal, knight>();
		generate<pseudo_legal, bishop>();
		generate<pseudo_legal, rook>();
		generate<pseudo_legal, queen>();
		generate<capture, pawn>();
		generate<quiet, pawn>();
		generate<quiet, king>();
		generate<castles, king>();
		generate<capture, king>();
	}
	else if (check_target != 0ULL && evasion_target == 0ULL) {
		if (!bits::more_than_one(check_target)) {
			generate<capture_promotion, pawn>();
			generate<capture, king>();
			generate<capture, pawn>();
			generate<capture, knight>();
			generate<capture, bishop>();
			generate<capture, rook>();
			generate<capture, queen>();
			generate<quiet, king>();
		}
		else {
			generate<capture, king>();
			generate<quiet, king>(); // more than one checker
		}
	}
	else if (check_target != 0ULL && evasion_target != 0ULL) {
		if (!bits::more_than_one(check_target)) {
			// capture moves
			generate<capture_promotion, pawn>();
			generate<capture, king>();
			generate<capture, pawn>();
			generate<pseudo_legal, knight>();
			generate<pseudo_legal, bishop>();
			generate<pseudo_legal, rook>();
			generate<pseudo_legal, queen>();

			// blocking moves
			generate<promotion, pawn>();
			generate<quiet, king>();
			generate<quiet, pawn>();
		}
		else {
			generate<capture, king>();
			generate<quiet, king>(); // more than one checker
		}
	}
}